

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

int telnet_raw_vprintf(telnet_t *telnet,char *fmt,__va_list_tag *va)

{
  int *piVar1;
  char *pcVar2;
  uint local_454;
  char **ppcStack_450;
  uint rs;
  char *output;
  char buffer [1024];
  va_list va_temp;
  __va_list_tag *va_local;
  char *fmt_local;
  telnet_t *telnet_local;
  
  ppcStack_450 = &output;
  buffer._1016_8_ = *(undefined8 *)va;
  local_454 = vsnprintf((char *)&output,0x400,fmt,buffer + 0x3f8);
  if (0x3ff < local_454) {
    ppcStack_450 = (char **)malloc((ulong)(local_454 + 1));
    if (ppcStack_450 == (char **)0x0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      _error(telnet,0x6ad,"telnet_raw_vprintf",TELNET_ENOMEM,0,"malloc() failed: %s",pcVar2);
      return -1;
    }
    buffer._1016_8_ = *(undefined8 *)va;
    local_454 = vsnprintf((char *)ppcStack_450,(ulong)(local_454 + 1),fmt,buffer + 0x3f8);
  }
  telnet_send(telnet,(char *)ppcStack_450,(ulong)local_454);
  if (ppcStack_450 != &output) {
    free(ppcStack_450);
  }
  return local_454;
}

Assistant:

int telnet_raw_vprintf(telnet_t *telnet, const char *fmt, va_list va) {
	va_list va_temp;
	char buffer[1024];
	char *output = buffer;
	unsigned int rs;

	/* format; allocate more space if necessary */
	va_copy(va_temp, va);
	rs = vsnprintf(buffer, sizeof(buffer), fmt, va_temp);
	va_end(va_temp);

	if (rs >= sizeof(buffer)) {
		output = (char*)malloc(rs + 1);
		if (output == 0) {
			_error(telnet, __LINE__, __func__, TELNET_ENOMEM, 0,
					"malloc() failed: %s", strerror(errno));
			return -1;
		}

		va_copy(va_temp, va);
		rs = vsnprintf(output, rs + 1, fmt, va_temp);
		va_end(va_temp);
	}

	/* send out the formatted data */
	telnet_send(telnet, output, rs);

	/* release allocated memory, if any */
	if (output != buffer) {
		free(output);
	}

	return rs;
}